

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

Message * __thiscall testing::Message::operator<<(Message *this,wstring *wstr)

{
  Message *in_RDI;
  size_t in_stack_00000028;
  wchar_t *in_stack_00000030;
  
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::length();
  internal::StreamWideCharsToMessage(in_stack_00000030,in_stack_00000028,this);
  return in_RDI;
}

Assistant:

Message& Message::operator <<(const ::std::wstring& wstr) {
  internal::StreamWideCharsToMessage(wstr.c_str(), wstr.length(), this);
  return *this;
}